

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_wsi_mux_dump_waiting_children(lws *wsi)

{
  uint uVar1;
  char *local_38;
  lws *local_10;
  lws *wsi_local;
  
  _lws_log(8,"%s: %p: children waiting for POLLOUT service:\n","lws_wsi_mux_dump_waiting_children",
           wsi);
  for (local_10 = (wsi->mux).child_list; local_10 != (lws *)0x0;
      local_10 = (local_10->mux).sibling_list) {
    uVar1 = 0x20;
    if ((local_10->mux).requested_POLLOUT != '\0') {
      uVar1 = 0x2a;
    }
    if (local_10->protocol == (lws_protocols *)0x0) {
      local_38 = "noprotocol";
    }
    else {
      local_38 = local_10->protocol->name;
    }
    _lws_log(8,"  %c %p: sid %u: 0x%x %s %s\n",(ulong)uVar1,local_10,(ulong)(local_10->mux).my_sid,
             (ulong)(local_10->wsistate & 0xffff),local_10->role_ops->name,local_38);
  }
  return;
}

Assistant:

void
lws_wsi_mux_dump_waiting_children(struct lws *wsi)
{
#if defined(_DEBUG)
	lwsl_info("%s: %p: children waiting for POLLOUT service:\n",
		  __func__, wsi);

	wsi = wsi->mux.child_list;
	while (wsi) {
		lwsl_info("  %c %p: sid %u: 0x%x %s %s\n",
			  wsi->mux.requested_POLLOUT ? '*' : ' ',
			  wsi, wsi->mux.my_sid, lwsi_state(wsi),
			  wsi->role_ops->name,
			  wsi->protocol ? wsi->protocol->name : "noprotocol");

		wsi = wsi->mux.sibling_list;
	}
#endif
}